

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_relation.cpp
# Opt level: O0

string * __thiscall
duckdb::TableFunctionRelation::ToString_abi_cxx11_(TableFunctionRelation *this,idx_t depth)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Value *in_RDX;
  long in_RSI;
  string *in_RDI;
  idx_t i;
  string function_call;
  reference in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *__lhs;
  char *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string local_70 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string local_38 [32];
  
  __lhs = in_RDI;
  ::std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    __rhs = local_40;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::size
                       ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)(in_RSI + 0x88));
    if (pbVar1 <= __rhs) break;
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::__cxx11::string::operator+=(local_38,", ");
    }
    in_stack_ffffffffffffff48 =
         vector<duckdb::Value,_true>::operator[]
                   ((vector<duckdb::Value,_true> *)__rhs,(size_type)in_stack_ffffffffffffff48);
    Value::ToString_abi_cxx11_(in_RDX);
    ::std::__cxx11::string::operator+=(local_38,local_70);
    ::std::__cxx11::string::~string(local_70);
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_40->field_0x1;
  }
  ::std::__cxx11::string::operator+=(local_38,")");
  Relation::RenderWhitespace_abi_cxx11_((idx_t)in_stack_ffffffffffffff78);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs)
  ;
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  ::std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

string TableFunctionRelation::ToString(idx_t depth) {
	string function_call = name + "(";
	for (idx_t i = 0; i < parameters.size(); i++) {
		if (i > 0) {
			function_call += ", ";
		}
		function_call += parameters[i].ToString();
	}
	function_call += ")";
	return RenderWhitespace(depth) + function_call;
}